

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.hpp
# Opt level: O1

baseHolder * __thiscall cs_impl::any::holder<unsigned_long>::duplicate(holder<unsigned_long> *this)

{
  baseHolder *pbVar1;
  
  if ((_DAT_00339330 == 0) || (cs::global_thread_counter != 0)) {
    pbVar1 = (baseHolder *)operator_new(0x10);
  }
  else {
    pbVar1 = *(baseHolder **)
              (&holder<std::_List_iterator<cs_impl::any>>::allocator + _DAT_00339330 * 8);
    _DAT_00339330 = _DAT_00339330 + -1;
  }
  pbVar1->_vptr_baseHolder = (_func_int **)&PTR__baseHolder_00328fb8;
  pbVar1[1]._vptr_baseHolder = (_func_int **)this->mDat;
  return pbVar1;
}

Assistant:

baseHolder *duplicate() override
			{
				return allocator.alloc(mDat);
			}